

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O3

string * FormatScriptError_abi_cxx11_(string *__return_storage_ptr__,ScriptError_t err)

{
  long lVar1;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  check_type cVar2;
  char *local_88;
  char *local_80;
  lazy_ostream local_78;
  undefined1 *local_68;
  char *local_60;
  assertion_result local_58;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  string *local_20;
  
  local_20 = *(string **)(in_FS_OFFSET + 0x28);
  lVar1 = 8;
  do {
    if (*(ScriptError_t *)(&UNK_013b2018 + lVar1) == err) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,*(char **)((long)&script_errors[0].err + lVar1),
                 (allocator<char> *)&local_78);
      goto LAB_005f5e51;
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x2b8);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x66;
  file.m_begin = (iterator)&local_30;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_40,msg);
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78.m_empty = false;
  local_78._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013b22e0;
  local_68 = boost::unit_test::lazy_ostream::inst;
  local_60 = "Unknown scripterror enumeration value, update script_errors in script_tests.cpp.";
  local_88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_80 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_58,&local_78,1,1,WARN,_cVar2,(size_t)&local_88,0x66);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
LAB_005f5e51:
  if (*(string **)(in_FS_OFFSET + 0x28) == local_20) {
    return *(string **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::string FormatScriptError(ScriptError_t err)
{
    for (const auto& se : script_errors)
        if (se.err == err)
            return se.name;
    BOOST_ERROR("Unknown scripterror enumeration value, update script_errors in script_tests.cpp.");
    return "";
}